

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

bool __thiscall xatlas::internal::segment::Atlas::isNormalSeam(Atlas *this,uint32_t edge)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Mesh *pMVar4;
  ulong uVar5;
  uint8_t *puVar6;
  char *__function;
  float *pfVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar12;
  int iVar11;
  
  pMVar4 = this->m_mesh;
  if (edge < (pMVar4->m_oppositeEdges).m_base.size) {
    uVar5 = (ulong)edge;
    uVar1 = *(uint *)((pMVar4->m_oppositeEdges).m_base.buffer + uVar5 * 4);
    if ((ulong)uVar1 == 0xffffffff) {
      return false;
    }
    if ((pMVar4->m_flags & 4) == 0) {
      uVar2 = (this->m_facePlanarRegionId).m_base.size;
      if ((edge / 3 < uVar2) && (uVar1 / 3 < uVar2)) {
        puVar6 = (this->m_facePlanarRegionId).m_base.buffer;
        uVar9 = (ulong)(uVar1 / 3);
        if (*(int *)(puVar6 + (uVar5 / 3) * 4) == *(int *)(puVar6 + uVar9 * 4)) {
          return false;
        }
        uVar2 = (this->m_faceNormals).m_base.size;
        if ((edge / 3 < uVar2) && (uVar1 / 3 < uVar2)) {
          puVar6 = (this->m_faceNormals).m_base.buffer;
          pfVar7 = (float *)(puVar6 + (uVar5 / 3) * 0xc);
          if (0.001 < ABS(*pfVar7 - *(float *)(puVar6 + uVar9 * 0xc))) {
            return true;
          }
          puVar6 = puVar6 + uVar9 * 0xc;
LAB_001b1ef8:
          if (ABS(pfVar7[1] - *(float *)(puVar6 + 4)) <= 0.001) {
            return 0.001 < ABS(pfVar7[2] - *(float *)(puVar6 + 8));
          }
          return true;
        }
LAB_001b2098:
        __function = 
        "const T &xatlas::internal::Array<xatlas::internal::Vector3>::operator[](uint32_t) const [T = xatlas::internal::Vector3]"
        ;
        goto LAB_001b208e;
      }
    }
    else {
      uVar2 = (pMVar4->m_indices).m_base.size;
      if (edge < uVar2) {
        iVar8 = edge % 3 + 1;
        iVar11 = 0;
        if (iVar8 != 3) {
          iVar11 = iVar8;
        }
        uVar10 = iVar11 + (edge / 3) * 3;
        if ((uVar10 < uVar2) && (uVar1 < uVar2)) {
          iVar8 = uVar1 % 3 + 1;
          iVar11 = 0;
          if (iVar8 != 3) {
            iVar11 = iVar8;
          }
          uVar12 = iVar11 + (uVar1 / 3) * 3;
          if (uVar12 < uVar2) {
            puVar6 = (pMVar4->m_indices).m_base.buffer;
            uVar2 = *(uint *)(puVar6 + uVar5 * 4);
            uVar10 = *(uint *)(puVar6 + (ulong)uVar10 * 4);
            uVar1 = *(uint *)(puVar6 + (ulong)uVar1 * 4);
            uVar12 = *(uint *)(puVar6 + (ulong)uVar12 * 4);
            uVar5 = (ulong)uVar12;
            if ((uVar10 == uVar1) && (uVar2 == uVar12)) {
              return false;
            }
            uVar3 = (pMVar4->m_normals).m_base.size;
            if ((uVar2 < uVar3) && (uVar12 < uVar3)) {
              puVar6 = (pMVar4->m_normals).m_base.buffer;
              pfVar7 = (float *)(puVar6 + (ulong)uVar2 * 0xc);
              if (0.001 < ABS(*pfVar7 - *(float *)(puVar6 + uVar5 * 0xc))) {
                return true;
              }
              if (0.001 < ABS(pfVar7[1] - *(float *)(puVar6 + uVar5 * 0xc + 4))) {
                return true;
              }
              if (0.001 < ABS(pfVar7[2] - *(float *)(puVar6 + uVar5 * 0xc + 8))) {
                return true;
              }
              if ((uVar10 < uVar3) && (uVar1 < uVar3)) {
                pfVar7 = (float *)(puVar6 + (ulong)uVar10 * 0xc);
                if (0.001 < ABS(*pfVar7 - *(float *)(puVar6 + (ulong)uVar1 * 0xc))) {
                  return true;
                }
                puVar6 = puVar6 + (ulong)uVar1 * 0xc;
                goto LAB_001b1ef8;
              }
            }
            goto LAB_001b2098;
          }
        }
      }
    }
  }
  __function = 
  "const T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) const [T = unsigned int]";
LAB_001b208e:
  __assert_fail("index < m_base.size",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                ,0x4a8,__function);
}

Assistant:

bool isNormalSeam(uint32_t edge) const
	{
		const uint32_t oppositeEdge = m_mesh->oppositeEdge(edge);
		if (oppositeEdge == UINT32_MAX)
			return false; // boundary edge
		if (m_mesh->flags() & MeshFlags::HasNormals) {
			const uint32_t v0 = m_mesh->vertexAt(meshEdgeIndex0(edge));
			const uint32_t v1 = m_mesh->vertexAt(meshEdgeIndex1(edge));
			const uint32_t ov0 = m_mesh->vertexAt(meshEdgeIndex0(oppositeEdge));
			const uint32_t ov1 = m_mesh->vertexAt(meshEdgeIndex1(oppositeEdge));
			if (v0 == ov1 && v1 == ov0)
				return false;
			return !equal(m_mesh->normal(v0), m_mesh->normal(ov1), kNormalEpsilon) || !equal(m_mesh->normal(v1), m_mesh->normal(ov0), kNormalEpsilon);
		}
		const uint32_t f0 = meshEdgeFace(edge);
		const uint32_t f1 = meshEdgeFace(oppositeEdge);
		if (m_facePlanarRegionId[f0] == m_facePlanarRegionId[f1])
			return false;
		return !equal(m_faceNormals[f0], m_faceNormals[f1], kNormalEpsilon);
	}